

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O0

void __thiscall SimpleConfiguration::insertSpin(SimpleConfiguration *this,bool spin,double tau)

{
  pair<bool,_double> local_30;
  double local_20;
  double tau_local;
  SimpleConfiguration *pSStack_10;
  bool spin_local;
  SimpleConfiguration *this_local;
  
  local_20 = tau;
  tau_local._7_1_ = spin;
  pSStack_10 = this;
  std::pair<bool,_double>::pair<bool_&,_double_&,_true>
            (&local_30,(bool *)((long)&tau_local + 7),&local_20);
  std::vector<std::pair<bool,_double>,_std::allocator<std::pair<bool,_double>_>_>::push_back
            (&this->c,&local_30);
  this->n = this->n + 1;
  return;
}

Assistant:

void insertSpin(bool spin, double tau) {
        c.push_back({spin, tau});
        ++n;
    }